

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
IsSubSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *sub_symbol,
           string *super_symbol)

{
  __type _Var1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_22;
  undefined1 local_21;
  string *super_symbol_local;
  string *sub_symbol_local;
  DescriptorIndex<std::pair<const_void_*,_int>_> *this_local;
  
  _Var1 = std::operator==(sub_symbol,super_symbol);
  local_21 = true;
  if (!_Var1) {
    bVar2 = HasPrefixString(super_symbol,sub_symbol);
    local_22 = false;
    if (bVar2) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)super_symbol);
      local_22 = *pcVar3 == '.';
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::IsSubSymbol(
    const string& sub_symbol, const string& super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
             super_symbol[sub_symbol.size()] == '.');
}